

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  Tables **alloc_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_01;
  pointer pbVar1;
  long lVar2;
  ServiceDescriptorProto *this_02;
  MethodDescriptorProto *this_03;
  __single_object this_04;
  bool bVar3;
  __type _Var4;
  DescriptorPool *pDVar5;
  FileDescriptor *pFVar6;
  undefined8 *puVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  void **ppvVar9;
  const_iterator cVar10;
  void **ppvVar11;
  const_iterator cVar12;
  Nullable<const_char_*> pcVar13;
  ulong uVar14;
  size_t full_name_size;
  int i;
  int iVar15;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *this_05;
  value_type *__x;
  Tables *pTVar16;
  long lVar17;
  DescriptorPool *pDVar18;
  string_view key;
  string_view element_name;
  string_view key_00;
  string_view name;
  string_view name_00;
  LogMessageFatal local_70;
  FileDescriptorProto *local_60;
  __single_object alloc;
  
  pDVar18 = this->pool_;
  pDVar5 = DescriptorPool::internal_generated_pool();
  if (pDVar18 != pDVar5) {
    DescriptorPool::generated_pool();
  }
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  key._M_str = (this->filename_)._M_dataplus._M_p;
  key._M_len = (this->filename_)._M_string_length;
  pFVar6 = DescriptorPool::Tables::FindFile(this->tables_,key);
  if ((pFVar6 == (FileDescriptor *)0x0) ||
     (bVar3 = ExistingFileMatchesProto(pFVar6->edition_,pFVar6,proto), !bVar3)) {
    alloc_00 = &this->tables_;
    lVar17 = 0;
    uVar14 = 0;
    while( true ) {
      pTVar16 = *alloc_00;
      pbVar1 = (pTVar16->pending_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pTVar16->pending_files_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar14)
      break;
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar1->_M_dataplus)._M_p + lVar17),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc));
      if (_Var4) {
        AddRecursiveImportError(this,proto,(int)uVar14);
        return (FileDescriptor *)0x0;
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0x20;
    }
    puVar7 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    __x = (value_type *)puVar7[1];
    if (__x < (value_type *)0x200) {
      local_60 = proto;
      if ((this->pool_->lazily_build_dependencies_ == false) &&
         (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
        __x = (value_type *)
              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pTVar16->pending_files_,__x);
        this_00 = &(proto->field_0)._impl_.dependency_;
        for (iVar15 = 0; pTVar16 = *alloc_00, iVar15 < *(int *)((long)&proto->field_0 + 0x10);
            iVar15 = iVar15 + 1) {
          pVVar8 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (&this_00->super_RepeatedPtrFieldBase,iVar15);
          __x = (value_type *)pVVar8->_M_string_length;
          key_00._M_str = (pVVar8->_M_dataplus)._M_p;
          key_00._M_len = (size_t)__x;
          pFVar6 = DescriptorPool::Tables::FindFile(pTVar16,key_00);
          if (pFVar6 == (FileDescriptor *)0x0) {
            pDVar18 = this->pool_;
            pDVar5 = pDVar18->underlay_;
            if (pDVar5 != (DescriptorPool *)0x0) {
              pVVar8 = internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                 (&this_00->super_RepeatedPtrFieldBase,iVar15);
              __x = (value_type *)pVVar8->_M_string_length;
              name._M_str = (pVVar8->_M_dataplus)._M_p;
              name._M_len = (size_t)__x;
              pFVar6 = DescriptorPool::FindFileByName(pDVar5,name);
              if (pFVar6 != (FileDescriptor *)0x0) goto LAB_001d050e;
              pDVar18 = this->pool_;
            }
            pVVar8 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                               (&this_00->super_RepeatedPtrFieldBase,iVar15);
            __x = (value_type *)pVVar8->_M_string_length;
            name_00._M_str = (pVVar8->_M_dataplus)._M_p;
            name_00._M_len = (size_t)__x;
            DescriptorPool::TryFindFileInFallbackDatabase
                      (pDVar18,name_00,this->deferred_validation_);
          }
LAB_001d050e:
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&pTVar16->pending_files_);
        pTVar16 = *alloc_00;
      }
      iVar15 = (int)__x;
      DescriptorPool::Tables::AddCheckpoint(pTVar16);
      std::make_unique<google::protobuf::internal::FlatAllocator>();
      this_04 = alloc;
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::FileDescriptor>
                ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  *)alloc._M_t.
                    super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                    .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                    _M_head_impl,iVar15);
      if (*(long *)this_04._M_t.
                   super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                   .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                   _M_head_impl == 0) {
        *(int *)((long)this_04._M_t.
                       super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                       _M_head_impl + 0x7c) =
             *(int *)((long)this_04._M_t.
                            super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                            ._M_head_impl + 0x7c) + 1;
        protobuf::(anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)this_04._M_t.
                      super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                      .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                      _M_head_impl,2);
        bVar3 = FileDescriptorProto::has_options(local_60);
        if (bVar3) {
          if (*(long *)this_04._M_t.
                       super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                       _M_head_impl != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x19b,"!has_allocated()");
            goto LAB_001d09dc;
          }
          *(int *)((long)this_04._M_t.
                         super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                         _M_head_impl + 0xa4) =
               *(int *)((long)this_04._M_t.
                              super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                              ._M_head_impl + 0xa4) + 1;
        }
        bVar3 = FileDescriptorProto::has_source_code_info(local_60);
        if (bVar3) {
          if (*(long *)this_04._M_t.
                       super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                       _M_head_impl != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x19b,"!has_allocated()");
            goto LAB_001d09dc;
          }
          *(int *)((long)this_04._M_t.
                         super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                         _M_head_impl + 0x78) =
               *(int *)((long)this_04._M_t.
                              super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                              ._M_head_impl + 0x78) + 1;
        }
        else if (*(long *)this_04._M_t.
                          super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                          .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                          ._M_head_impl != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x19b,"!has_allocated()");
          goto LAB_001d09dc;
        }
        lVar2 = *(long *)(((ulong)(local_60->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc) + 8);
        this_01 = &(local_60->field_0)._impl_.service_;
        *(int *)((long)this_04._M_t.
                       super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                       _M_head_impl + 0x70) =
             *(int *)((long)this_04._M_t.
                            super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                            ._M_head_impl + 0x70) + *(int *)((long)&local_60->field_0 + 0x58) * 0x40
        ;
        ppvVar9 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
        cVar10 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end(this_01);
        lVar17 = lVar2 + 1;
        if (lVar2 == 0) {
          lVar17 = 0;
        }
        for (; ppvVar9 != cVar10.it_; ppvVar9 = ppvVar9 + 1) {
          this_02 = (ServiceDescriptorProto *)*ppvVar9;
          bVar3 = ServiceDescriptorProto::has_options(this_02);
          if (bVar3) {
            if (*(long *)this_04._M_t.
                         super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                         _M_head_impl != 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_70,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x19b,"!has_allocated()");
              goto LAB_001d09dc;
            }
            *(int *)((long)this_04._M_t.
                           super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                           ._M_head_impl + 0x9c) =
                 *(int *)((long)this_04._M_t.
                                super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                ._M_head_impl + 0x9c) + 1;
          }
          full_name_size =
               *(long *)(((ulong)(this_02->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8) + lVar17;
          anon_unknown_24::
          FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ::PlanEntityNames((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                             *)this_04._M_t.
                               super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                               .
                               super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                               ._M_head_impl,full_name_size);
          if (*(long *)this_04._M_t.
                       super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                       .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                       _M_head_impl != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x19b,"!has_allocated()");
            goto LAB_001d09dc;
          }
          this_05 = &(this_02->field_0)._impl_.method_;
          *(int *)((long)this_04._M_t.
                         super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                         _M_head_impl + 0x70) =
               *(int *)((long)this_04._M_t.
                              super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                              ._M_head_impl + 0x70) +
               *(int *)((long)&this_02->field_0 + 0x10) * 0x50;
          ppvVar11 = internal::RepeatedPtrFieldBase::elements(&this_05->super_RepeatedPtrFieldBase);
          cVar12 = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::end(this_05);
          for (; ppvVar11 != cVar12.it_; ppvVar11 = ppvVar11 + 1) {
            this_03 = (MethodDescriptorProto *)*ppvVar11;
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::PlanEntityNames((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               *)this_04._M_t.
                                 super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                 ._M_head_impl,
                              *(long *)(((ulong)(this_03->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                        0xfffffffffffffffc) + 8) + full_name_size + 1);
            bVar3 = MethodDescriptorProto::has_options(this_03);
            if (bVar3) {
              if (*(long *)this_04._M_t.
                           super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                           ._M_head_impl != 0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          (&local_70,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                           ,0x19b,"!has_allocated()");
                goto LAB_001d09dc;
              }
              *(int *)((long)this_04._M_t.
                             super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                             .
                             super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                             ._M_head_impl + 0xa0) =
                   *(int *)((long)this_04._M_t.
                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                  .
                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                  ._M_head_impl + 0xa0) + 1;
            }
          }
        }
        PlanAllocationSize(&(local_60->field_0)._impl_.message_type_,
                           *(size_t *)
                            (((ulong)(local_60->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc) + 8),
                           (FlatAllocator *)
                           this_04._M_t.
                           super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                           ._M_head_impl);
        PlanAllocationSize(&(local_60->field_0)._impl_.enum_type_,
                           *(size_t *)
                            (((ulong)(local_60->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc) + 8),
                           (FlatAllocator *)
                           this_04._M_t.
                           super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                           ._M_head_impl);
        PlanAllocationSize(&(local_60->field_0)._impl_.extension_,
                           *(size_t *)
                            (((ulong)(local_60->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc) + 8),
                           (FlatAllocator *)
                           this_04._M_t.
                           super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                           ._M_head_impl);
        iVar15 = RepeatedField<int>::size(&(local_60->field_0)._impl_.weak_dependency_);
        anon_unknown_24::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::PlanArray<int>((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          *)this_04._M_t.
                            super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                            ._M_head_impl,iVar15);
        iVar15 = RepeatedField<int>::size(&(local_60->field_0)._impl_.public_dependency_);
        anon_unknown_24::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::PlanArray<int>((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          *)this_04._M_t.
                            super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                            ._M_head_impl,iVar15);
        if (*(long *)this_04._M_t.
                     super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                     .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                     _M_head_impl == 0) {
          *(int *)((long)this_04._M_t.
                         super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                         .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                         _M_head_impl + 0x70) =
               *(int *)((long)this_04._M_t.
                              super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                              ._M_head_impl + 0x70) + *(int *)((long)&local_60->field_0 + 0x10) * 8;
          protobuf::(anonymous_namespace)::
          FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
          ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                    ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                      *)alloc._M_t.
                        super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                        .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>.
                        _M_head_impl,alloc_00);
          pFVar6 = BuildFileImpl(this,local_60,
                                 (FlatAllocator *)
                                 alloc._M_t.
                                 super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                 ._M_head_impl);
          if (pFVar6 == (FileDescriptor *)0x0) {
            DescriptorPool::Tables::RollbackToLastCheckpoint(*alloc_00,this->deferred_validation_);
LAB_001d09a3:
            std::
            unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
            ::~unique_ptr(&alloc);
            return pFVar6;
          }
          DescriptorPool::Tables::ClearLastCheckpoint(*alloc_00);
          pFVar6->finished_building_ = true;
          pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                              (*(int *)((long)alloc._M_t.
                                              super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                              .
                                              super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                              ._M_head_impl + 0x70),
                               *(int *)((long)alloc._M_t.
                                              super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                              .
                                              super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                              ._M_head_impl + 0xa8),
                               "total_.template Get<U>() == used_.template Get<U>()");
          if (pcVar13 == (Nullable<const_char_*>)0x0) {
            pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                (*(int *)((long)alloc._M_t.
                                                super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                .
                                                super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                ._M_head_impl + 0x74),
                                 *(int *)((long)alloc._M_t.
                                                super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                .
                                                super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                ._M_head_impl + 0xac),
                                 "total_.template Get<U>() == used_.template Get<U>()");
            if (pcVar13 == (Nullable<const_char_*>)0x0) {
              pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                  (*(int *)((long)alloc._M_t.
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x78),
                                   *(int *)((long)alloc._M_t.
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xb0),
                                   "total_.template Get<U>() == used_.template Get<U>()");
              if (pcVar13 == (Nullable<const_char_*>)0x0) {
                pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                    (*(int *)((long)alloc._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x7c),
                                     *(int *)((long)alloc._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xb4),
                                     "total_.template Get<U>() == used_.template Get<U>()");
                if (pcVar13 == (Nullable<const_char_*>)0x0) {
                  pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                      (*(int *)((long)alloc._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x80),
                                       *(int *)((long)alloc._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xb8),
                                       "total_.template Get<U>() == used_.template Get<U>()");
                  if (pcVar13 == (Nullable<const_char_*>)0x0) {
                    pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                        (*(int *)((long)alloc._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x84),
                                         *(int *)((long)alloc._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xbc),
                                         "total_.template Get<U>() == used_.template Get<U>()");
                    if (pcVar13 == (Nullable<const_char_*>)0x0) {
                      pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                          (*(int *)((long)alloc._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x88),
                                           *(int *)((long)alloc._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xc0),
                                           "total_.template Get<U>() == used_.template Get<U>()");
                      if (pcVar13 == (Nullable<const_char_*>)0x0) {
                        pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                            (*(int *)((long)alloc._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x8c),
                                             *(int *)((long)alloc._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xc4),
                                             "total_.template Get<U>() == used_.template Get<U>()");
                        if (pcVar13 == (Nullable<const_char_*>)0x0) {
                          pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                              (*(int *)((long)alloc._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x90),
                                               *(int *)((long)alloc._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 200),
                                               "total_.template Get<U>() == used_.template Get<U>()"
                                              );
                          if (pcVar13 == (Nullable<const_char_*>)0x0) {
                            pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                                (*(int *)((long)alloc._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x94),
                                                 *(int *)((long)alloc._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xcc),
                                                 "total_.template Get<U>() == used_.template Get<U>()"
                                                );
                            if (pcVar13 == (Nullable<const_char_*>)0x0) {
                              pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                                  (*(int *)((long)alloc._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x98),
                                                  *(int *)((long)alloc._M_t.
                                                                                                                                  
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xd0),
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                              if (pcVar13 == (Nullable<const_char_*>)0x0) {
                                pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                                    (*(int *)((long)alloc._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0x9c),
                                                  *(int *)((long)alloc._M_t.
                                                                                                                                  
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xd4),
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                if (pcVar13 == (Nullable<const_char_*>)0x0) {
                                  pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                                      (*(int *)((long)alloc._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xa0),
                                                  *(int *)((long)alloc._M_t.
                                                                                                                                  
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xd8),
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                  if (pcVar13 == (Nullable<const_char_*>)0x0) {
                                    pcVar13 = absl::lts_20250127::log_internal::Check_EQImpl
                                                        (*(int *)((long)alloc._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xa4),
                                                  *(int *)((long)alloc._M_t.
                                                                                                                                  
                                                  super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>
                                                  ._M_head_impl + 0xdc),
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                    if (pcVar13 == (Nullable<const_char_*>)0x0) goto LAB_001d09a3;
                                    absl::lts_20250127::log_internal::LogMessageFatal::
                                    LogMessageFatal(&local_70,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                                  ,0x286,pcVar13);
                                  }
                                  else {
                                    absl::lts_20250127::log_internal::LogMessageFatal::
                                    LogMessageFatal(&local_70,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                                  ,0x286,pcVar13);
                                  }
                                }
                                else {
                                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                            (&local_70,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                             ,0x286,pcVar13);
                                }
                              }
                              else {
                                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                          (&local_70,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                           ,0x286,pcVar13);
                              }
                            }
                            else {
                              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                        (&local_70,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                         ,0x286,pcVar13);
                            }
                          }
                          else {
                            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                      (&local_70,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                       ,0x286,pcVar13);
                          }
                        }
                        else {
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    (&local_70,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                     ,0x286,pcVar13);
                        }
                      }
                      else {
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  (&local_70,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                   ,0x286,pcVar13);
                      }
                    }
                    else {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                (&local_70,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                 ,0x286,pcVar13);
                    }
                  }
                  else {
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              (&local_70,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                               ,0x286,pcVar13);
                  }
                }
                else {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            (&local_70,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                             ,0x286,pcVar13);
                }
              }
              else {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          (&local_70,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                           ,0x286,pcVar13);
              }
            }
            else {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_70,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x286,pcVar13);
            }
          }
          else {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x286,pcVar13);
          }
        }
        else {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x19b,"!has_allocated()");
        }
      }
      else {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x19b,"!has_allocated()");
      }
LAB_001d09dc:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_70);
    }
    pFVar6 = (FileDescriptor *)0x0;
    element_name._M_str = (char *)*puVar7;
    element_name._M_len = (size_t)__x;
    AddError(this,element_name,&proto->super_Message,NAME,"Package name is too long");
  }
  return pFVar6;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  // Ensure the generated pool has been lazily initialized.  This is most
  // important for protos that use C++-specific features, since that extension
  // is only registered lazily and we always parse options into the generated
  // pool.
  if (pool_ != DescriptorPool::internal_generated_pool()) {
    DescriptorPool::generated_pool();
  }

  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file->edition(), existing_file,
                                 proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO:  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  static const int kMaximumPackageLength = 511;
  if (proto.package().size() > kMaximumPackageLength) {
    AddError(proto.package(), proto, DescriptorPool::ErrorCollector::NAME,
             "Package name is too long");
    return nullptr;
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i),
                                               deferred_validation_);
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  auto alloc = absl::make_unique<internal::FlatAllocator>();
  PlanAllocationSize(proto, *alloc);
  alloc->FinalizePlanning(tables_);
  FileDescriptor* result = BuildFileImpl(proto, *alloc);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    alloc->ExpectConsumed();
  } else {
    tables_->RollbackToLastCheckpoint(deferred_validation_);
  }

  return result;
}